

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O0

void __thiscall discordpp::ReadyEvent::~ReadyEvent(ReadyEvent *this)

{
  ReadyEvent *this_local;
  
  field<discordpp::Application>::~field(&this->application);
  omittable_field<std::array<int,_2UL>_>::~omittable_field(&this->shard);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~field
            (&this->resume_gateway_url);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~field
            (&this->session_id);
  field<std::vector<discordpp::Guild,_std::allocator<discordpp::Guild>_>_>::~field(&this->guilds);
  field<discordpp::User>::~field(&this->user);
  field<int>::~field(&this->v);
  return;
}

Assistant:

ReadyEvent(
        field<int> v = uninitialized,
        field<User> user = uninitialized,
        field<std::vector<Guild> > guilds = uninitialized,
        field<std::string> session_id = uninitialized,
        field<std::string> resume_gateway_url = uninitialized,
        omittable_field<std::array<int, 2>> shard = omitted,
        field<Application> application = uninitialized
    ):
        v(v),
        user(user),
        guilds(guilds),
        session_id(session_id),
        resume_gateway_url(resume_gateway_url),
        shard(shard),
        application(application)
    {}